

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcBindModuleFunctionWrapper
                  (char *module,void *func,_func_void_void_ptr_char_ptr_char_ptr *ptr,char *name,
                  int index)

{
  int iVar1;
  char *local_60;
  char *errorPos;
  TraceScope traceScope;
  int index_local;
  char *name_local;
  _func_void_void_ptr_char_ptr_char_ptr *ptr_local;
  void *func_local;
  char *module_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    module_local._7_1_ = false;
  }
  else {
    if (nullcBindModuleFunctionWrapper::token == '\0') {
      iVar1 = __cxa_guard_acquire(&nullcBindModuleFunctionWrapper::token);
      if (iVar1 != 0) {
        nullcBindModuleFunctionWrapper::token =
             NULLC::TraceGetToken("nullc","nullcBindModuleFunctionWrapper");
        __cxa_guard_release(&nullcBindModuleFunctionWrapper::token);
      }
    }
    NULLC::TraceScope::TraceScope((TraceScope *)&errorPos,nullcBindModuleFunctionWrapper::token);
    NULLC::TraceLabel(module);
    if (NULLC::compilerCtx != 0) {
      __assert_fail("!compilerCtx",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/nullc.cpp"
                    ,0x134,
                    "nullres nullcBindModuleFunctionWrapper(const char *, void *, void (*)(void *, char *, char *), const char *, int)"
                   );
    }
    if (func == (void *)0x0) {
      __assert_fail("func",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/nullc.cpp"
                    ,0x136,
                    "nullres nullcBindModuleFunctionWrapper(const char *, void *, void (*)(void *, char *, char *), const char *, int)"
                   );
    }
    local_60 = (char *)0x0;
    module_local._7_1_ =
         AddModuleFunction((Allocator *)NULLC::allocator,module,(_func_void *)0x0,func,ptr,name,
                           index,&local_60,NULLC::errorBuf,0x10000,NULLC::optimizationLevel);
    if (module_local._7_1_) {
      GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
                ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
    }
    else {
      GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
                ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
      NULLC::nullcLastError = NULLC::errorBuf;
    }
    NULLC::TraceScope::~TraceScope((TraceScope *)&errorPos);
  }
  return module_local._7_1_;
}

Assistant:

nullres nullcBindModuleFunctionWrapper(const char* module, void *func, void (*ptr)(void *func, char* retBuf, char* argBuf), const char* name, int index)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcBindModuleFunctionWrapper");
	TRACE_LABEL(module);

	assert(!compilerCtx);

	assert(func);

	const char *errorPos = NULL;

	if(!AddModuleFunction(&allocator, module, NULL, func, ptr, name, index, &errorPos, errorBuf, NULLC_ERROR_BUFFER_SIZE, NULLC::optimizationLevel))
	{
		allocator.Clear();

		nullcLastError = errorBuf;

		return false;
	}

	allocator.Clear();

	return true;
}